

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutGetCones(If_Man_t *p)

{
  void **ppvVar1;
  If_Obj_t *pObj;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  lVar7 = (long)p->vObjs->nSize;
  if (lVar7 < 1) {
    uVar5 = 0;
  }
  else {
    ppvVar1 = p->vObjs->pArray;
    lVar6 = 0;
    uVar5 = 0;
    do {
      pObj = (If_Obj_t *)ppvVar1[lVar6];
      if ((((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
         (pObj->nRefs != 0)) {
        uVar3 = If_CutGetCone_rec(p,pObj,&pObj->CutBest);
        uVar5 = uVar5 + (uVar3 ^ 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  Abc_Print(1,"Cound not find boundary for %d nodes.\n",(ulong)uVar5);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Cones");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar7 + lVar4) / 1000000.0);
  return 1;
}

Assistant:

int If_CutGetCones( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            Counter += !If_CutGetCone_rec( p, pObj, If_ObjCutBest(pObj) );
//            Abc_Print( 1, "%d ", If_CutGetCutMinLevel( p, If_ObjCutBest(pObj) ) );
        }
    }
    Abc_Print( 1, "Cound not find boundary for %d nodes.\n", Counter );
    Abc_PrintTime( 1, "Cones", Abc_Clock() - clk );
    return 1;
}